

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O3

int fill_GOST_EC_params(EC_KEY *eckey,int nid)

{
  R3410_ec_params *pRVar1;
  int iVar2;
  BN_CTX *ctx;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  EC_GROUP *group;
  EC_POINT *generator;
  int iVar6;
  R3410_ec_params *pRVar7;
  undefined1 auVar8 [16];
  BIGNUM *cofactor;
  BIGNUM *y;
  BIGNUM *x;
  BIGNUM *b;
  BIGNUM *a;
  BIGNUM *q;
  BIGNUM *p;
  BIGNUM *local_88;
  BIGNUM *local_80;
  BIGNUM *local_78;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  EC_KEY *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  iVar2 = nid + -0x158;
  if (2 < nid - 0x4a0U) {
    iVar2 = nid;
  }
  pRVar7 = R3410_2012_512_paramset;
  iVar6 = R3410_2012_512_paramset[0].nid;
  while (iVar6 != 0) {
    if (iVar6 == iVar2) goto LAB_0011f701;
    pRVar1 = pRVar7 + 1;
    pRVar7 = pRVar7 + 1;
    iVar6 = pRVar1->nid;
  }
  pRVar7 = R3410_2001_paramset;
  iVar6 = R3410_2001_paramset[0].nid;
  while (iVar6 != 0) {
    if (iVar6 == iVar2) goto LAB_0011f701;
    pRVar1 = pRVar7 + 1;
    pRVar7 = pRVar7 + 1;
    iVar6 = pRVar1->nid;
  }
  pRVar7 = (R3410_ec_params *)0x0;
LAB_0011f701:
  local_58 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  local_70 = (BIGNUM *)0x0;
  local_78 = (BIGNUM *)0x0;
  local_80 = (BIGNUM *)0x0;
  local_88 = (BIGNUM *)0x0;
  if (eckey == (EC_KEY *)0x0 || pRVar7 == (R3410_ec_params *)0x0) {
    iVar6 = 0x83;
    iVar2 = 0x65;
LAB_0011f7a0:
    ERR_GOST_error(0x66,iVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar2);
    return 0;
  }
  if ((EC_GROUP *)pRVar7->group == (EC_GROUP *)0x0) {
    iVar2 = nid;
    ctx = BN_CTX_new();
    if (ctx == (BN_CTX *)0x0) {
      iVar6 = 0xc0100;
      iVar2 = 0x73;
      goto LAB_0011f7a0;
    }
    local_50 = eckey;
    BN_CTX_start(ctx);
    local_58 = BN_CTX_get(ctx);
    local_38 = local_58;
    local_68 = BN_CTX_get(ctx);
    local_40 = local_68;
    local_70 = BN_CTX_get(ctx);
    local_48 = local_70;
    pBVar3 = BN_CTX_get(ctx);
    local_78 = pBVar3;
    pBVar4 = BN_CTX_get(ctx);
    local_80 = pBVar4;
    pBVar5 = BN_CTX_get(ctx);
    local_60 = pBVar5;
    local_88 = BN_CTX_get(ctx);
    auVar8._0_4_ = -(uint)((int)((ulong)local_38 >> 0x20) == 0 && (int)local_38 == 0);
    auVar8._4_4_ = -(uint)((int)local_40 == 0 && (int)((ulong)local_40 >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)((ulong)local_48 >> 0x20) == 0 && (int)local_48 == 0);
    auVar8._12_4_ = -(uint)((int)pBVar3 == 0 && (int)((ulong)pBVar3 >> 0x20) == 0);
    iVar2 = movmskps(iVar2,auVar8);
    if (((pBVar5 == (BIGNUM *)0x0 || pBVar4 == (BIGNUM *)0x0) || iVar2 != 0) ||
        local_88 == (BIGNUM *)0x0) {
      iVar6 = 0xc0100;
      iVar2 = 0x80;
    }
    else {
      iVar2 = BN_hex2bn(&local_58,pRVar7->p);
      if ((((iVar2 != 0) && (iVar2 = BN_hex2bn(&local_68,pRVar7->a), iVar2 != 0)) &&
          (iVar2 = BN_hex2bn(&local_70,pRVar7->b), iVar2 != 0)) &&
         (iVar2 = BN_hex2bn(&local_88,pRVar7->cofactor), iVar2 != 0)) {
        group = EC_GROUP_new_curve_GFp(local_58,local_68,local_70,ctx);
        if (group == (EC_GROUP *)0x0) {
          iVar2 = 0x8e;
        }
        else {
          generator = EC_POINT_new(group);
          if (generator != (EC_POINT *)0x0) {
            iVar2 = BN_hex2bn(&local_78,pRVar7->x);
            if (((iVar2 == 0) || (iVar2 = BN_hex2bn(&local_80,pRVar7->y), iVar2 == 0)) ||
               ((iVar2 = EC_POINT_set_affine_coordinates(group,generator,local_78,local_80,ctx),
                iVar2 == 0 || (iVar2 = BN_hex2bn(&local_60,pRVar7->q), iVar2 == 0)))) {
              iVar2 = 0x9c;
            }
            else {
              iVar2 = EC_GROUP_set_generator(group,generator,local_60,local_88);
              if (iVar2 == 0) {
                iVar2 = 0xa1;
              }
              else {
                EC_GROUP_set_curve_name(group,nid);
                pRVar7->group = (EC_GROUP *)group;
                iVar2 = EC_KEY_set_group((EC_KEY *)local_50,group);
                iVar6 = 1;
                if (iVar2 != 0) goto LAB_0011fa4f;
                iVar2 = 0xa7;
              }
            }
            ERR_GOST_error(0x66,0xc0103,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar2);
            goto LAB_0011f782;
          }
          iVar2 = 0x94;
        }
        ERR_GOST_error(0x66,0xc0100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                       ,iVar2);
        generator = (EC_POINT *)0x0;
        goto LAB_0011f782;
      }
      iVar6 = 0xc0103;
      iVar2 = 0x88;
    }
    ERR_GOST_error(0x66,iVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar2);
    generator = (EC_POINT *)0x0;
    iVar6 = 0;
  }
  else {
    EC_GROUP_set_curve_name((EC_GROUP *)pRVar7->group,nid);
    iVar2 = EC_KEY_set_group((EC_KEY *)eckey,(EC_GROUP *)pRVar7->group);
    if (iVar2 != 0) {
      return 1;
    }
    ERR_GOST_error(0x66,0xc0103,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,0x6c);
    generator = (EC_POINT *)0x0;
    ctx = (BN_CTX *)0x0;
LAB_0011f782:
    iVar6 = 0;
  }
LAB_0011fa4f:
  EC_POINT_free(generator);
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  return iVar6;
}

Assistant:

int fill_GOST_EC_params(EC_KEY *eckey, int nid)
{
    R3410_ec_params *params = gost_nid2params(nid);
    EC_GROUP *grp = NULL;
    EC_POINT *P = NULL;
    BIGNUM *p = NULL, *q = NULL, *a = NULL, *b = NULL, *x = NULL, *y =
        NULL, *cofactor = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!eckey || !params) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, GOST_R_UNSUPPORTED_PARAMETER_SET);
        return 0;
    }

    if (params->group) {
        EC_GROUP_set_curve_name(params->group, nid);
        if (!EC_KEY_set_group(eckey, params->group)) {
            GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
            goto end;
        }
        return 1;
    }

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    p = BN_CTX_get(ctx);
    a = BN_CTX_get(ctx);
    b = BN_CTX_get(ctx);
    x = BN_CTX_get(ctx);
    y = BN_CTX_get(ctx);
    q = BN_CTX_get(ctx);
    cofactor = BN_CTX_get(ctx);
    if (!p || !a || !b || !x || !y || !q || !cofactor) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&p, params->p)
        || !BN_hex2bn(&a, params->a)
        || !BN_hex2bn(&b, params->b)
        || !BN_hex2bn(&cofactor, params->cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    grp = EC_GROUP_new_curve_GFp(p, a, b, ctx);
    if (!grp) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    P = EC_POINT_new(grp);
    if (!P) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&x, params->x)
        || !BN_hex2bn(&y, params->y)
        || !EC_POINT_set_affine_coordinates(grp, P, x, y, ctx)
        || !BN_hex2bn(&q, params->q)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    if (!EC_GROUP_set_generator(grp, P, q, cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    EC_GROUP_set_curve_name(grp, nid);
    params->group = grp;
    if (!EC_KEY_set_group(eckey, grp)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    ok = 1;
 end:
    EC_POINT_free(P);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}